

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

DependencyInfo * __thiscall
helics::TimeDependencies::getDependencyInfo(TimeDependencies *this,GlobalFederateId gid)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  pointer pDVar4;
  BaseType in_ESI;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  *in_RDI;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  res;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffffa8
  ;
  bool local_45;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_20 [2];
  GlobalFederateId local_c;
  reference local_8;
  
  local_c.gid = in_ESI;
  cVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::cbegin
                    (in_stack_ffffffffffffffa8);
  cVar3 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::cend
                    (in_stack_ffffffffffffffa8);
  local_20[0] = std::
                lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                          (cVar2._M_current,cVar3._M_current,&local_c);
  std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::cend
            (in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::
          operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                    (in_RDI,(__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_stack_ffffffffffffffa8);
  local_45 = true;
  if (!bVar1) {
    pDVar4 = __gnu_cxx::
             __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator->(local_20);
    local_45 = GlobalFederateId::operator!=(&pDVar4->fedID,local_c);
  }
  if (local_45 == false) {
    local_8 = __gnu_cxx::
              __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
              ::operator*(local_20);
  }
  else {
    local_8 = (reference)0x0;
  }
  return local_8;
}

Assistant:

const DependencyInfo* TimeDependencies::getDependencyInfo(GlobalFederateId gid) const
{
    auto res = std::lower_bound(dependencies.cbegin(), dependencies.cend(), gid, dependencyCompare);
    if ((res == dependencies.cend()) || (res->fedID != gid)) {
        return nullptr;
    }

    return &(*res);
}